

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestParser.cpp
# Opt level: O0

void __thiscall UnitTest_parser_exp2::UnitTest_parser_exp2(UnitTest_parser_exp2 *this)

{
  undefined8 *in_RDI;
  UnitTestBase *unaff_retaddr;
  
  UnitTestBase::UnitTestBase(unaff_retaddr);
  *in_RDI = &PTR_Run_002688a0;
  std::__cxx11::string::operator=((string *)(in_RDI + 1),"parser_exp2");
  return;
}

Assistant:

TEST_CASE(parser_exp2)
{
    auto root = Parse("a = 1 + 2 + 3 * 4");
    auto exp_list = ASTFind<luna::ExpressionList>(root, AcceptAST());
    EXPECT_TRUE(exp_list->exp_list_.size() == 1);
    auto &exp = exp_list->exp_list_[0];
    auto bin_exp = dynamic_cast<luna::BinaryExpression *>(exp.get());
    EXPECT_TRUE(bin_exp);
    EXPECT_TRUE(bin_exp->op_token_.token_ == '+');

    // 1 + 2
    auto left = dynamic_cast<luna::BinaryExpression *>(bin_exp->left_.get());
    EXPECT_TRUE(left);
    EXPECT_TRUE(left->op_token_.token_ == '+');
    EXPECT_TRUE(dynamic_cast<luna::Terminator *>(left->left_.get()));
    EXPECT_TRUE(dynamic_cast<luna::Terminator *>(left->right_.get()));

    // 3 * 4
    auto right = dynamic_cast<luna::BinaryExpression *>(bin_exp->right_.get());
    EXPECT_TRUE(right);
    EXPECT_TRUE(right->op_token_.token_ == '*');
    EXPECT_TRUE(dynamic_cast<luna::Terminator *>(right->left_.get()));
    EXPECT_TRUE(dynamic_cast<luna::Terminator *>(right->right_.get()));
}